

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffshft(fitsfile *fptr,LONGLONG firstbyte,LONGLONG nbytes,LONGLONG nshift,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  LONGLONG LVar4;
  long lVar5;
  ulong nbytes_00;
  char buffer [100000];
  
  if (0 < *status) {
    return *status;
  }
  lVar5 = nbytes + firstbyte;
  LVar4 = firstbyte;
  if (0 < nshift) {
    LVar4 = lVar5;
  }
  do {
    if (nbytes == 0) {
      if (fptr->Fptr->hdutype == 1) {
        iVar1 = 0x20;
      }
      else {
        iVar1 = 0;
      }
      memset(buffer,iVar1,100000);
      if (nshift < 0) {
        firstbyte = lVar5 + nshift;
      }
      lVar5 = -nshift;
      if (0 < nshift) {
        lVar5 = nshift;
      }
      ffmbyt(fptr,firstbyte,0,status);
      for (; lVar5 != 0; lVar5 = lVar5 - lVar3) {
        lVar3 = 100000;
        if (lVar5 < 100000) {
          lVar3 = lVar5;
        }
        ffpbyt(fptr,lVar3,buffer,status);
      }
LAB_0013ad38:
      return *status;
    }
    nbytes_00 = 100000;
    if (nbytes < 100000) {
      nbytes_00 = nbytes;
    }
    uVar2 = 0;
    if (0 < nshift) {
      uVar2 = nbytes_00;
    }
    lVar3 = LVar4 - uVar2;
    ffmbyt(fptr,lVar3,0,status);
    ffgbyt(fptr,nbytes_00,buffer,status);
    ffmbyt(fptr,lVar3 + nshift,1,status);
    iVar1 = ffpbyt(fptr,nbytes_00,buffer,status);
    if (0 < iVar1) {
      ffpmsg("Error while shifting block (ffshft)");
      goto LAB_0013ad38;
    }
    nbytes = nbytes - nbytes_00;
    LVar4 = lVar3 + (nbytes_00 & nshift >> 0x3f);
  } while( true );
}

Assistant:

int ffshft(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstbyte, /* I - position of first byte in block to shift */
           LONGLONG nbytes,    /* I - size of block of bytes to shift          */
           LONGLONG nshift,    /* I - size of shift in bytes (+ or -)          */
           int *status)     /* IO - error status                            */
/*
    Shift block of bytes by nshift bytes (positive or negative).
    A positive nshift value moves the block down further in the file, while a
    negative value shifts the block towards the beginning of the file.
*/
{
#define shftbuffsize 100000
    long ntomov;
    LONGLONG ptr, ntodo;
    char buffer[shftbuffsize];

    if (*status > 0)
        return(*status);

    ntodo = nbytes;   /* total number of bytes to shift */

    if (nshift > 0)
            /* start at the end of the block and work backwards */
            ptr = firstbyte + nbytes;
    else
            /* start at the beginning of the block working forwards */
            ptr = firstbyte;

    while (ntodo)
    {
        /* number of bytes to move at one time */
        ntomov = (long) (minvalue(ntodo, shftbuffsize));

        if (nshift > 0)     /* if moving block down ... */
            ptr -= ntomov;

        /* move to position and read the bytes to be moved */

        ffmbyt(fptr, ptr, REPORT_EOF, status);
        ffgbyt(fptr, ntomov, buffer, status);

        /* move by shift amount and write the bytes */
        ffmbyt(fptr, ptr + nshift, IGNORE_EOF, status);
        if (ffpbyt(fptr, ntomov, buffer, status) > 0)
        {
           ffpmsg("Error while shifting block (ffshft)");
           return(*status);
        }

        ntodo -= ntomov;
        if (nshift < 0)     /* if moving block up ... */
            ptr += ntomov;
    }

    /* now overwrite the old data with fill */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
       memset(buffer, 32, shftbuffsize); /* fill ASCII tables with spaces */
    else
       memset(buffer,  0, shftbuffsize); /* fill other HDUs with zeros */


    if (nshift < 0)
    {
        ntodo = -nshift;
        /* point to the end of the shifted block */
        ptr = firstbyte + nbytes + nshift;
    }
    else
    {
        ntodo = nshift;
        /* point to original beginning of the block */
        ptr = firstbyte;
    }

    ffmbyt(fptr, ptr, REPORT_EOF, status);

    while (ntodo)
    {
        ntomov = (long) (minvalue(ntodo, shftbuffsize));
        ffpbyt(fptr, ntomov, buffer, status);
        ntodo -= ntomov;
    }
    return(*status);
}